

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdLut.c
# Opt level: O3

void Sbd_ProblemCollectSolution(int nStrs,Sbd_Str_t *pStr0,Vec_Int_t *vLits)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Sbd_Str_t *pSVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  word wVar11;
  uint uVar12;
  
  if (nStrs < 1) {
    uVar4 = 0;
  }
  else {
    pSVar7 = pStr0 + nStrs;
    uVar9 = 0;
    do {
      pStr0->Res = 0;
      uVar1 = pStr0->nVarIns;
      uVar8 = (uint)uVar9;
      if (pStr0->fLut == 0) {
        if ((int)uVar1 < 1) {
LAB_0054e0c6:
          __assert_fail("nIters == 1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                        ,0xaa,"void Sbd_ProblemCollectSolution(int, Sbd_Str_t *, Vec_Int_t *)");
        }
        uVar4 = uVar1 + uVar8;
        uVar3 = 0;
        iVar6 = 0;
        do {
          if (((int)uVar8 < 0) || (vLits->nSize <= (int)(uVar8 + (int)uVar3))) goto LAB_0054e088;
          if (vLits->pArray[uVar9 + uVar3] < 0) goto LAB_0054e0a7;
          if ((vLits->pArray[uVar9 + uVar3] & 1U) == 0) {
            pStr0->Res = (long)pStr0->VarIns[uVar3];
            iVar6 = iVar6 + 1;
          }
          uVar3 = uVar3 + 1;
        } while (uVar1 != uVar3);
        if (iVar6 != 1) goto LAB_0054e0c6;
      }
      else {
        if (uVar1 == 0x1f) {
          wVar11 = 0;
          uVar4 = uVar8;
        }
        else {
          uVar3 = 0;
          do {
            if (((int)uVar8 < 0) || (vLits->nSize <= (int)(uVar8 + (int)uVar3))) {
LAB_0054e088:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            if (vLits->pArray[uVar9 + uVar3] < 0) {
LAB_0054e0a7:
              __assert_fail("Lit >= 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x130,"int Abc_LitIsCompl(int)");
            }
            if ((vLits->pArray[uVar9 + uVar3] & 1U) == 0) {
              *(ulong *)(pStr0->VarIns + (uVar3 >> 6 & 0x3ffffff) * 2 + 10) =
                   *(ulong *)(pStr0->VarIns + (uVar3 >> 6 & 0x3ffffff) * 2 + 10) |
                   1L << ((byte)uVar3 & 0x3f);
            }
            uVar3 = uVar3 + 1;
          } while (1 << ((byte)uVar1 & 0x1f) != (int)uVar3);
          if ((int)uVar1 < 0) {
            __assert_fail("nVars >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                          ,0x489,"word Abc_Tt6Stretch(word, int)");
          }
          uVar4 = uVar8 + (int)uVar3;
          wVar11 = pStr0->Res;
        }
        uVar8 = uVar1;
        if (uVar1 < 3) {
          uVar8 = 3;
        }
        uVar5 = uVar8;
        if (uVar8 == 3) {
          uVar5 = 4;
        }
        uVar2 = uVar5;
        if (uVar5 == 4) {
          uVar2 = 5;
        }
        if (1 < uVar2 - 5) {
          __assert_fail("nVars == 6",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                        ,0x496,"word Abc_Tt6Stretch(word, int)");
        }
        uVar10 = (uint)wVar11;
        uVar12 = -(uVar10 & 1);
        if ((ulong)uVar1 != 0) {
          uVar12 = uVar10;
        }
        uVar12 = (uVar12 & 3) * 5;
        if (1 < uVar1) {
          uVar12 = uVar10;
        }
        uVar9 = (ulong)((uVar12 & 0xf) << 4 | uVar12 & 0xf);
        if (2 < uVar1) {
          uVar9 = wVar11;
        }
        uVar3 = (ulong)(uint)((int)(uVar9 & 0xff) << 8) | uVar9 & 0xff;
        if (uVar8 != 3) {
          uVar3 = uVar9;
        }
        uVar9 = (ulong)(uint)((int)uVar3 << 0x10) | uVar3 & 0xffff;
        if (uVar5 != 4) {
          uVar9 = uVar3;
        }
        uVar3 = uVar9 << 0x20 | uVar9 & 0xffffffff;
        if (uVar2 != 5) {
          uVar3 = uVar9;
        }
        pStr0->Res = uVar3;
      }
      pStr0 = pStr0 + 1;
      uVar9 = (ulong)uVar4;
    } while (pStr0 < pSVar7);
  }
  if (uVar4 == vLits->nSize) {
    return;
  }
  __assert_fail("iLit == Vec_IntSize(vLits)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sbd/sbdLut.c"
                ,0xad,"void Sbd_ProblemCollectSolution(int, Sbd_Str_t *, Vec_Int_t *)");
}

Assistant:

void Sbd_ProblemCollectSolution( int nStrs, Sbd_Str_t * pStr0, Vec_Int_t * vLits )
{
    Sbd_Str_t * pStr;
    int m, nIters, iLit = 0;
    for ( pStr = pStr0; pStr < pStr0 + nStrs; pStr++ )
    {
        pStr->Res = 0;
        if ( pStr->fLut )
        {
            nIters = 1 << pStr->nVarIns;
            for ( m = 0; m < nIters; m++, iLit++ )
                if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, iLit)) )
                    Abc_TtSetBit( &pStr->Res, m );
            pStr->Res = Abc_Tt6Stretch( pStr->Res, pStr->nVarIns );
        }
        else
        {
            nIters = 0;
            for ( m = 0; m < pStr->nVarIns; m++, iLit++ )
                if ( !Abc_LitIsCompl(Vec_IntEntry(vLits, iLit)) )
                {
                    pStr->Res = pStr->VarIns[m];
                    nIters++;
                }
            assert( nIters == 1 );
        }
    }
    assert( iLit == Vec_IntSize(vLits) );
}